

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingRenderCase::init
          (LayoutBindingRenderCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ShaderType SVar2;
  TestType TVar3;
  int iVar4;
  deUint32 dVar5;
  GLint GVar6;
  uint uVar7;
  int extraout_EAX;
  undefined4 extraout_var;
  NotSupportedError *pNVar9;
  undefined4 extraout_var_00;
  TestError *pTVar10;
  int bpoint_1;
  int iVar11;
  uint uVar12;
  iterator iVar13;
  uint uVar14;
  int bpoint_2;
  GLint maxFragmentUnits;
  GLint maxCombinedUnits;
  GLint maxVertexUnits;
  GLint numBindingPoints;
  vector<unsigned_int,_std::allocator<unsigned_int>_> highBindingPoints;
  Random rnd_1;
  int bpoint;
  Random rnd;
  uint local_20c;
  uint local_208;
  int local_204;
  uint local_200;
  uint local_1fc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  deRandom local_1d8;
  undefined1 local_1c8 [8];
  uint *puStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  ios_base local_150 [272];
  deRandom local_40;
  long lVar8;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  dVar5 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_40,dVar5 ^ 0xff23a4);
  local_1fc = 0;
  local_200 = 0;
  local_208 = 0;
  local_204 = 0;
  (**(code **)(lVar8 + 0x868))(this->m_maxVertexUnitsEnum);
  (**(code **)(lVar8 + 0x868))(this->m_maxFragmentUnitsEnum,&local_208);
  (**(code **)(lVar8 + 0x868))(this->m_maxCombinedUnitsEnum,&local_204);
  (**(code **)(lVar8 + 0x868))(this->m_maxBindingPointEnum,&local_1fc);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"Querying available uniform numbers failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x192);
  local_1c8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&puStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&puStack_1c0,"Maximum units for uniform type in the vertex shader: ",0x35);
  std::ostream::operator<<((ostringstream *)&puStack_1c0,local_200);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&puStack_1c0);
  std::ios_base::~ios_base(local_150);
  local_1c8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&puStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&puStack_1c0,"Maximum units for uniform type in the fragment shader: ",0x37)
  ;
  std::ostream::operator<<((ostringstream *)&puStack_1c0,local_208);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&puStack_1c0);
  std::ios_base::~ios_base(local_150);
  local_1c8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&puStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&puStack_1c0,"Maximum combined units for uniform type: ",0x29);
  std::ostream::operator<<((ostringstream *)&puStack_1c0,local_204);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&puStack_1c0);
  std::ios_base::~ios_base(local_150);
  local_1c8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&puStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&puStack_1c0,"Maximum binding point for uniform type: ",0x28);
  std::ostream::operator<<((ostringstream *)&puStack_1c0,local_1fc - 1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&puStack_1c0);
  std::ios_base::~ios_base(local_150);
  SVar2 = this->m_shaderType;
  uVar7 = local_200;
  if (((SVar2 != SHADERTYPE_VERTEX) && (uVar7 = local_208, SVar2 != SHADERTYPE_FRAGMENT)) &&
     (uVar7 = 0, SVar2 == SHADERTYPE_ALL)) {
    uVar7 = local_204 / 2;
  }
  TVar3 = this->m_testType;
  if (TVar3 < TESTTYPE_BINDING_MULTIPLE) {
    iVar4 = 1;
LAB_00419525:
    this->m_numBindings = iVar4;
  }
  else {
    if (TVar3 - TESTTYPE_BINDING_ARRAY < 2) {
      if ((int)uVar7 < 2) {
        pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1c8 = (undefined1  [8])&local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Not enough uniforms available for test","");
        tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)local_1c8);
        __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
LAB_00419504:
      dVar5 = deRandom_getUint32(&local_40);
      uVar12 = 7;
      if (uVar7 < 7) {
        uVar12 = uVar7;
      }
      iVar4 = dVar5 % (uVar12 - 1) + 2;
      goto LAB_00419525;
    }
    if (TVar3 == TESTTYPE_BINDING_MULTIPLE) {
      if ((int)uVar7 < 2) {
        pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1c8 = (undefined1  [8])&local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Not enough uniforms available for test","");
        tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)local_1c8);
        __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      goto LAB_00419504;
    }
  }
  uVar7 = local_1fc;
  SVar2 = this->m_shaderType;
  if (SVar2 == SHADERTYPE_VERTEX) {
LAB_00419549:
    iVar4 = this->m_numBindings;
    if ((int)local_200 < iVar4) {
      pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1c8 = (undefined1  [8])&local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Vertex shader: not enough uniforms available for test","");
      tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)local_1c8);
      __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if ((SVar2 == SHADERTYPE_ALL) || (SVar2 == SHADERTYPE_FRAGMENT)) {
      if ((int)local_208 < iVar4) {
LAB_004195ec:
        pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1c8 = (undefined1  [8])&local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Fragment shader: not enough uniforms available for test","")
        ;
        tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)local_1c8);
        __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      if ((SVar2 == SHADERTYPE_ALL) && (local_204 < iVar4 * 2)) {
        pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1c8 = (undefined1  [8])&local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Not enough uniforms available for test","");
        tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)local_1c8);
        __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  else if (SVar2 == SHADERTYPE_FRAGMENT) {
    iVar4 = this->m_numBindings;
    if ((int)local_208 < iVar4) goto LAB_004195ec;
  }
  else {
    if (SVar2 == SHADERTYPE_ALL) goto LAB_00419549;
    iVar4 = this->m_numBindings;
  }
  if ((int)local_1fc < iVar4) {
    pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1c8 = (undefined1  [8])&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"Not enough binding points available for test","");
    tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)local_1c8);
    __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  dVar5 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_1d8,dVar5 ^ 0xff23a4);
  switch(this->m_testType) {
  case TESTTYPE_BINDING_SINGLE:
    dVar5 = deRandom_getUint32(&local_1d8);
    local_1c8._0_4_ = dVar5 % uVar7;
    iVar13._M_current =
         (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->m_bindings,iVar13,(int *)local_1c8);
      break;
    }
    *iVar13._M_current = dVar5 % uVar7;
    goto LAB_00419960;
  case TESTTYPE_BINDING_MAX:
    local_1c8._0_4_ = uVar7 - 1;
    iVar13._M_current =
         (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->m_bindings,iVar13,(int *)local_1c8);
      break;
    }
    *iVar13._M_current = uVar7 - 1;
LAB_00419960:
    (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = iVar13._M_current + 1;
    break;
  case TESTTYPE_BINDING_MULTIPLE:
    local_1c8 = (undefined1  [8])0x0;
    puStack_1c0 = (uint *)0x0;
    uVar14 = 0;
    local_1b8._M_allocated_capacity = 0;
    local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (uint *)0x0;
    local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    uVar12 = (int)uVar7 / 2;
    if (1 < (int)uVar7) {
      do {
        local_20c = uVar14;
        if (puStack_1c0 == (uint *)local_1b8._M_allocated_capacity) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,
                     (iterator)puStack_1c0,&local_20c);
        }
        else {
          *puStack_1c0 = uVar14;
          puStack_1c0 = puStack_1c0 + 1;
        }
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
    }
    if (0 < (int)uVar7) {
      do {
        local_20c = uVar12;
        if (local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_1f8,
                     (iterator)
                     local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_20c);
        }
        else {
          *local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = uVar12;
          local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar12 = uVar12 + 1;
      } while ((int)uVar12 < (int)uVar7);
    }
    de::Random::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((Random *)&local_1d8,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )local_1c8,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )puStack_1c0);
    de::Random::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((Random *)&local_1d8,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    if (0 < this->m_numBindings) {
      uVar7 = 0;
      do {
        if ((uVar7 & 1) == 0) {
          local_20c = puStack_1c0[-1];
          puStack_1c0 = puStack_1c0 + -1;
          iVar13._M_current =
               (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar13._M_current ==
              (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&this->m_bindings,iVar13,(int *)&local_20c
                      );
          }
          else {
LAB_0041986b:
            *iVar13._M_current = local_20c;
            (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)((uint *)iVar13._M_current + 1);
          }
        }
        else {
          local_20c = local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1];
          local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
          iVar13._M_current =
               (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar13._M_current !=
              (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_0041986b;
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->m_bindings,iVar13,(int *)&local_20c);
        }
        uVar7 = uVar7 + 1;
      } while ((int)uVar7 < this->m_numBindings);
    }
    if (local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1c8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity - (long)local_1c8);
    }
    break;
  case TESTTYPE_BINDING_ARRAY:
    iVar4 = this->m_numBindings;
    dVar5 = deRandom_getUint32(&local_1d8);
    iVar11 = 0;
    if (0 < this->m_numBindings) {
      do {
        iVar1 = dVar5 % ((uVar7 - iVar4) + 1) + iVar11;
        local_1c8._0_4_ = iVar1;
        iVar13._M_current =
             (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar13._M_current ==
            (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->m_bindings,iVar13,(int *)local_1c8);
        }
        else {
          *iVar13._M_current = iVar1;
          (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar13._M_current + 1;
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < this->m_numBindings);
    }
    break;
  case TESTTYPE_BINDING_MAX_ARRAY:
    iVar4 = this->m_numBindings;
    if (0 < iVar4) {
      iVar11 = 0;
      do {
        iVar1 = (uVar7 - iVar4) + iVar11;
        local_1c8._0_4_ = iVar1;
        iVar13._M_current =
             (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar13._M_current ==
            (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->m_bindings,iVar13,(int *)local_1c8);
        }
        else {
          *iVar13._M_current = iVar1;
          (this->m_bindings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar13._M_current + 1;
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < this->m_numBindings);
    }
  }
  local_1c8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&puStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&puStack_1c0,"Creating test shaders",0x15);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&puStack_1c0);
  std::ios_base::~ios_base(local_150);
  iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  this->m_program = (ShaderProgram *)CONCAT44(extraout_var_00,iVar4);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (ShaderProgram *)CONCAT44(extraout_var_00,iVar4));
  if ((this->m_program->m_program).m_info.linkOk == false) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    local_1c8 = (undefined1  [8])&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Shader compile failed","");
    tcu::TestError::TestError(pTVar10,(string *)local_1c8);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  dVar5 = (this->m_program->m_program).m_program;
  GVar6 = (**(code **)(lVar8 + 0x780))(dVar5,"a_position");
  this->m_shaderProgramPosLoc = GVar6;
  uVar7 = (**(code **)(lVar8 + 0xb48))(dVar5);
  this->m_shaderProgramArrayNdxLoc = uVar7;
  this->m_vertexBuffer = 0;
  this->m_indexBuffer = 0;
  local_1c8 = (undefined1  [8])0xbf800000bf800000;
  puStack_1c0 = (pointer)0x3f8000003f800000;
  local_1b8._M_allocated_capacity = 0x3f800000bf800000;
  local_1b8._8_8_ = 0x3f8000003f800000;
  local_1a8 = 0x3f800000;
  uStack_1a4 = 0xbf800000;
  uStack_1a0 = 0x3f800000;
  uStack_19c = 0x3f800000;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x200010000;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish._4_4_,0x30002);
  if ((int)(uVar7 | this->m_shaderProgramPosLoc) < 0) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,(char *)0x0,
               "(m_shaderProgramPosLoc >= 0) && (m_shaderProgramArrayNdxLoc >= 0)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x1f7);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar8 + 0x6c8))(1,&this->m_indexBuffer);
  (**(code **)(lVar8 + 0x40))(0x8893,this->m_indexBuffer);
  (**(code **)(lVar8 + 0x150))(0x8893,0xc,&local_1f8,0x88e4);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"Index buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x1fd);
  (**(code **)(lVar8 + 0x6c8))(1,&this->m_vertexBuffer);
  (**(code **)(lVar8 + 0x40))(0x8892,this->m_vertexBuffer);
  (**(code **)(lVar8 + 0x150))(0x8892,0x30,local_1c8,0x88e4);
  (**(code **)(lVar8 + 0x610))(this->m_shaderProgramPosLoc);
  (**(code **)(lVar8 + 0x19f0))(this->m_shaderProgramPosLoc,3,0x1406,0,0,0);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"Vertex buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x205);
  return extraout_EAX;
}

Assistant:

void LayoutBindingRenderCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	{
		de::Random				rnd					(deStringHash(getName()) ^ 0xff23a4);
		glw::GLint				numBindingPoints	= 0;	// Number of available binding points
		glw::GLint				maxVertexUnits		= 0;	// Available uniforms in the vertex shader
		glw::GLint				maxFragmentUnits	= 0;	// Available uniforms in the fragment shader
		glw::GLint				maxCombinedUnits	= 0;	// Available uniforms in all the shader stages combined
		glw::GLint				maxUnits			= 0;	// Maximum available uniforms for this test

		gl.getIntegerv(m_maxVertexUnitsEnum, &maxVertexUnits);
		gl.getIntegerv(m_maxFragmentUnitsEnum, &maxFragmentUnits);
		gl.getIntegerv(m_maxCombinedUnitsEnum, &maxCombinedUnits);
		gl.getIntegerv(m_maxBindingPointEnum, &numBindingPoints);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Querying available uniform numbers failed");

		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the vertex shader: " << maxVertexUnits << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the fragment shader: " << maxFragmentUnits << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum combined units for uniform type: " << maxCombinedUnits << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum binding point for uniform type: " << numBindingPoints-1 << tcu::TestLog::EndMessage;

		// Select maximum number of uniforms used for the test
		switch (m_shaderType)
		{
			case SHADERTYPE_VERTEX:
				maxUnits = maxVertexUnits;
				break;

			case SHADERTYPE_FRAGMENT:
				maxUnits = maxFragmentUnits;
				break;

			case SHADERTYPE_ALL:
				maxUnits = maxCombinedUnits/2;
				break;

			default:
				DE_ASSERT(false);
		}

		// Select the number of uniforms (= bindings) used for this test
		switch (m_testType)
		{
			case TESTTYPE_BINDING_SINGLE:
			case TESTTYPE_BINDING_MAX:
				m_numBindings = 1;
				break;

			case TESTTYPE_BINDING_MULTIPLE:
				if (maxUnits < 2)
					throw tcu::NotSupportedError("Not enough uniforms available for test");
				m_numBindings = rnd.getInt(2, deMin32(MAX_UNIFORM_MULTIPLE_INSTANCES, maxUnits));
				break;

			case TESTTYPE_BINDING_ARRAY:
			case TESTTYPE_BINDING_MAX_ARRAY:
				if (maxUnits < 2)
					throw tcu::NotSupportedError("Not enough uniforms available for test");
				m_numBindings = rnd.getInt(2, deMin32(MAX_UNIFORM_ARRAY_SIZE, maxUnits));
				break;

			default:
				DE_ASSERT(false);
		}

		// Check that we have enough uniforms in different shaders to perform the tests
		if ( ((m_shaderType == SHADERTYPE_VERTEX) || (m_shaderType == SHADERTYPE_ALL)) && (maxVertexUnits < m_numBindings) )
			throw tcu::NotSupportedError("Vertex shader: not enough uniforms available for test");
		if ( ((m_shaderType == SHADERTYPE_FRAGMENT) || (m_shaderType == SHADERTYPE_ALL)) && (maxFragmentUnits < m_numBindings) )
			throw tcu::NotSupportedError("Fragment shader: not enough uniforms available for test");
		if ( (m_shaderType == SHADERTYPE_ALL) && (maxCombinedUnits < m_numBindings*2) )
			throw tcu::NotSupportedError("Not enough uniforms available for test");

		// Check that we have enough binding points to perform the tests
		if (numBindingPoints < m_numBindings)
			throw tcu::NotSupportedError("Not enough binding points available for test");

		// Initialize the binding points i.e. populate the two binding point vectors
		initBindingPoints(0, numBindingPoints);
	}

	// Generate the shader program - note: this must be done after deciding the binding points
	DE_ASSERT(!m_program);
	m_testCtx.getLog() << tcu::TestLog::Message << "Creating test shaders" << tcu::TestLog::EndMessage;
	m_program = generateShaders();
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("Shader compile failed");

	// Setup vertex and index buffers
	{
		// Get attribute and uniform locations
		const deUint32	program	= m_program->getProgram();

		m_shaderProgramPosLoc		= gl.getAttribLocation(program, "a_position");
		m_shaderProgramArrayNdxLoc	= gl.getUniformLocation(program, "u_arrayNdx");
		m_vertexBuffer				= 0;
		m_indexBuffer				= 0;

		// Setup buffers so that we render one quad covering the whole viewport
		const Vec3 vertices[] =
		{
			Vec3(-1.0f, -1.0f, +1.0f),
			Vec3(+1.0f, -1.0f, +1.0f),
			Vec3(+1.0f, +1.0f, +1.0f),
			Vec3(-1.0f, +1.0f, +1.0f),
		};

		const deUint16 indices[] =
		{
			0, 1, 2,
			0, 2, 3,
		};

		TCU_CHECK((m_shaderProgramPosLoc >= 0) && (m_shaderProgramArrayNdxLoc >= 0));

		// Generate and bind index buffer
		gl.genBuffers(1, &m_indexBuffer);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (DE_LENGTH_OF_ARRAY(indices)*(glw::GLsizeiptr)sizeof(indices[0])), &indices[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Index buffer setup failed");

		// Generate and bind vertex buffer
		gl.genBuffers(1, &m_vertexBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_vertexBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, (DE_LENGTH_OF_ARRAY(vertices)*(glw::GLsizeiptr)sizeof(vertices[0])), &vertices[0], GL_STATIC_DRAW);
		gl.enableVertexAttribArray(m_shaderProgramPosLoc);
		gl.vertexAttribPointer(m_shaderProgramPosLoc, 3, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Vertex buffer setup failed");
	}
}